

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_2dPoint __thiscall
ON_OBSOLETE_V5_DimRadial::Dim2dPoint(ON_OBSOLETE_V5_DimRadial *this,int point_index)

{
  ON_2dPoint OVar1;
  int iVar2;
  ON_2dPoint *pOVar3;
  int local_24;
  int point_index_local;
  ON_OBSOLETE_V5_DimRadial *this_local;
  ON_2dPoint p2;
  
  iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if ((iVar2 < 4) || (point_index < 0)) {
    p2.x = -1.23432101234321e+308;
    this_local = (ON_OBSOLETE_V5_DimRadial *)0xffe5f8bd9e331dd2;
  }
  else {
    local_24 = point_index;
    if (point_index == 10000) {
      local_24 = 2;
    }
    if (local_24 < 4) {
      pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,local_24);
      this_local = (ON_OBSOLETE_V5_DimRadial *)pOVar3->x;
      p2.x = pOVar3->y;
    }
    else {
      p2.x = -1.23432101234321e+308;
      this_local = (ON_OBSOLETE_V5_DimRadial *)0xffe5f8bd9e331dd2;
    }
  }
  OVar1.y = p2.x;
  OVar1.x = (double)this_local;
  return OVar1;
}

Assistant:

ON_2dPoint ON_OBSOLETE_V5_DimRadial::Dim2dPoint(
      int point_index
      ) const
{
  ON_2dPoint p2;
  if ( m_points.Count() < dim_pt_count || point_index < 0 )
  {
    p2.x = p2.y = ON_UNSET_VALUE;
  }
  else
  {
    if ( text_pivot_pt == point_index )
    {
      point_index = tail_pt_index;
    }
    if ( point_index < dim_pt_count )
    {
      p2 = m_points[point_index];
    }    
    else
    {
      p2.x = p2.y = ON_UNSET_VALUE;
    }
  }
  return p2;
}